

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

char * ident_val_add_module_prefix(char *value,lyxml_elem *xml,ly_ctx *ctx)

{
  int iVar1;
  lyxml_attr *plVar2;
  lys_module *plVar3;
  char *pcVar4;
  undefined8 uVar5;
  bool bVar6;
  char *local_20;
  char *str;
  
  do {
    for (plVar2 = xml->attr; bVar6 = plVar2 != (lyxml_attr *)0x0, bVar6; plVar2 = plVar2->next) {
      if ((plVar2->type == LYXML_ATTR_NS) && (plVar2->name == (char *)0x0)) goto LAB_00126c80;
    }
    xml = xml->parent;
LAB_00126c80:
    if ((bVar6) || (xml == (lyxml_elem *)0x0)) {
      if (bVar6) {
        plVar3 = ly_ctx_get_module_by_ns(ctx,plVar2->value,(char *)0x0,1);
        if (plVar3 != (lys_module *)0x0) {
          iVar1 = asprintf(&local_20,"%s:%s",plVar3->name,value);
          if (iVar1 != -1) {
            lydict_remove(ctx,value);
            pcVar4 = lydict_insert_zc(ctx,local_20);
            return pcVar4;
          }
          ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "ident_val_add_module_prefix");
          return (char *)0x0;
        }
        uVar5 = 0x49b;
      }
      else {
        uVar5 = 0x494;
      }
      ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
             ,uVar5);
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

static const char *
ident_val_add_module_prefix(const char *value, const struct lyxml_elem *xml, struct ly_ctx *ctx)
{
    const struct lyxml_ns *ns;
    const struct lys_module *mod;
    char *str;

    do {
        LY_TREE_FOR((struct lyxml_ns *)xml->attr, ns) {
            if ((ns->type == LYXML_ATTR_NS) && !ns->prefix) {
                /* match */
                break;
            }
        }
        if (!ns) {
            xml = xml->parent;
        }
    } while (!ns && xml);

    if (!ns) {
        /* no default namespace */
        LOGINT(ctx);
        return NULL;
    }

    /* find module */
    mod = ly_ctx_get_module_by_ns(ctx, ns->value, NULL, 1);
    if (!mod) {
        LOGINT(ctx);
        return NULL;
    }

    if (asprintf(&str, "%s:%s", mod->name, value) == -1) {
        LOGMEM(ctx);
        return NULL;
    }
    lydict_remove(ctx, value);

    return lydict_insert_zc(ctx, str);
}